

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myserver.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  _Alloc_hider __buf;
  int iVar2;
  int iVar3;
  size_t sVar4;
  DIR *pDVar5;
  char *pcVar6;
  ssize_t sVar7;
  SendMessage *this;
  long *plVar8;
  ostream *poVar9;
  size_type *psVar10;
  char message [12];
  char FAILURE [5];
  char USERDIR [6];
  string commandResult;
  socklen_t addrlen;
  char EXECUTEPENDING [4];
  char SUCCESS [4];
  char message_2 [12];
  sockaddr_in cliaddress;
  sockaddr_in address;
  char buffer [1024];
  int local_524;
  string local_520;
  undefined4 local_500;
  undefined1 local_4fc;
  char *local_4f8;
  char local_4f0 [8];
  char *local_4e8;
  char *local_4e0;
  char local_4d8 [16];
  int local_4c8;
  socklen_t local_4c4 [3];
  string local_4b8;
  undefined1 *local_498 [2];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  sockaddr local_448;
  int local_438 [2];
  char acStack_430 [1024];
  
  builtin_strncpy(local_4f0,"users",6);
  local_4c4[2] = 0xa4b4f;
  local_4fc = 0;
  local_500 = 0xa525245;
  local_4c4[1] = 0xa5045;
  if (argc == 3) {
    iVar2 = atoi(argv[1]);
    pcVar6 = argv[2];
    local_468[0] = local_458;
    sVar4 = strlen(local_4f0);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,local_4f0,local_4f0 + sVar4)
    ;
    local_4f8 = pcVar6;
    pDVar5 = opendir(pcVar6);
    if (pDVar5 == (DIR *)0x0) {
      mkdir(local_4f8,0x1ff);
    }
    if (local_468[0] != local_458) {
      operator_delete(local_468[0]);
    }
    iVar3 = socket(2,1,0);
    local_448.sa_data[6] = '\0';
    local_448.sa_data[7] = '\0';
    local_448.sa_data[8] = '\0';
    local_448.sa_data[9] = '\0';
    local_448.sa_data[10] = '\0';
    local_448.sa_data[0xb] = '\0';
    local_448.sa_data[0xc] = '\0';
    local_448.sa_data[0xd] = '\0';
    local_448.sa_data._0_2_ = (ushort)iVar2 << 8 | (ushort)iVar2 >> 8;
    this = (SendMessage *)(ulong)CONCAT22((short)((uint)iVar2 >> 0x10),local_448.sa_data._0_2_);
    local_448.sa_family = 2;
    local_448.sa_data._2_4_ = 0;
    iVar2 = bind(iVar3,&local_448,0x10);
    if (iVar2 == 0) {
      local_4c8 = iVar3;
      listen(iVar3,5);
      local_4c4[0] = 0x10;
      local_524 = 0;
      do {
        puts("Waiting for connections...");
        iVar2 = accept(local_4c8,(sockaddr *)local_478,local_4c4);
        if (0 < iVar2) {
          pcVar6 = inet_ntoa((in_addr)local_478._4_4_);
          printf("Client connected from %s:%d...\n",pcVar6,
                 (ulong)(ushort)(local_478._2_2_ << 8 | (ushort)local_478._2_2_ >> 8));
          local_438 = (int  [2])0x20656d6f636c6557;
          builtin_strncpy(acStack_430,"to myserver, Please enter your command:\n",0x29);
          sVar4 = strlen((char *)local_438);
          send(iVar2,local_438,sVar4,0);
        }
        local_4e8 = local_4d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"");
        do {
          sVar7 = recv(iVar2,local_438,0x3ff,0);
          if (sVar7 < 1) {
            if (sVar7 != 0) {
              perror("recv error");
              local_524 = 1;
              bVar1 = false;
              goto LAB_00103c77;
            }
            puts("Client closed remote socket");
            break;
          }
          *(undefined1 *)((long)local_438 + sVar7) = 0;
          printf("Message received: %s",local_438);
          iVar3 = strncasecmp((char *)local_438,"send",4);
          if (iVar3 == 0) {
            this = (SendMessage *)operator_new(0xd0);
            bVar1 = true;
            SendMessage::SendMessage(this,local_4f8);
          }
          else {
            iVar3 = strncasecmp((char *)local_438,"list",4);
            if (iVar3 == 0) {
              this = (SendMessage *)operator_new(0x68);
              bVar1 = true;
              ListMessage::ListMessage((ListMessage *)this,local_4f8);
            }
            else {
              iVar3 = strncasecmp((char *)local_438,"read",4);
              if (iVar3 == 0) {
                this = (SendMessage *)operator_new(0x70);
                bVar1 = true;
                ReadMessage::ReadMessage((ReadMessage *)this,local_4f8);
              }
              else {
                iVar3 = strncasecmp((char *)local_438,"del",3);
                if (iVar3 == 0) {
                  this = (SendMessage *)operator_new(0x70);
                  bVar1 = true;
                  DeleteMessage::DeleteMessage((DeleteMessage *)this,local_4f8);
                }
                else {
                  iVar3 = strncasecmp((char *)local_438,"quit",4);
                  if (iVar3 == 0) {
                    local_520._M_dataplus._M_p = (pointer)0x6c6f686563616c70;
                    local_520._M_string_length = CONCAT44(local_520._M_string_length._4_4_,0x726564)
                    ;
                    send(iVar2,local_4c4 + 2,3,0);
                    sVar4 = strlen((char *)&local_520);
                    recv(iVar2,&local_520,sVar4 - 1,0);
                    std::__cxx11::string::_M_replace((ulong)&local_4e8,0,local_4e0,0x1070ef);
                    send(iVar2,local_4e8,(size_t)local_4e0,0);
                    break;
                  }
                  local_520._M_dataplus._M_p = (pointer)0x6c6f686563616c70;
                  local_520._M_string_length = CONCAT44(local_520._M_string_length._4_4_,0x726564);
                  send(iVar2,&local_500,4,0);
                  sVar4 = strlen((char *)&local_520);
                  recv(iVar2,&local_520,sVar4 - 1,0);
                  std::__cxx11::string::_M_replace((ulong)&local_4e8,0,local_4e0,0x1070f5);
                  send(iVar2,local_4e8,(size_t)local_4e0,0);
                  bVar1 = false;
                }
              }
            }
          }
          if (bVar1) {
            do {
              ServerOperation::getStatus_abi_cxx11_(&local_520,&this->super_ServerOperation);
              send(iVar2,local_520._M_dataplus._M_p,local_520._M_string_length,0);
              sVar7 = recv(iVar2,local_438,0x3ff,0);
              bVar1 = 0 < sVar7;
              if (sVar7 < 1) {
                if (sVar7 == 0) {
                  puts("Client closed remote socket");
                  iVar3 = 6;
                }
                else {
                  perror("recv error");
                  iVar3 = 1;
                  local_524 = 1;
                }
              }
              else {
                *(undefined1 *)((long)local_438 + sVar7) = 0;
                iVar3 = 0;
                printf("Message received: %s\n",local_438);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_520._M_dataplus._M_p != &local_520.field_2) {
                operator_delete(local_520._M_dataplus._M_p);
              }
              if (iVar3 != 0) {
                if (iVar3 != 6) goto LAB_00103c77;
                break;
              }
              local_498[0] = local_488;
              sVar4 = strlen((char *)local_438);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_498,local_438,(long)local_438 + sVar4);
              iVar3 = (**(this->super_ServerOperation)._vptr_ServerOperation)
                                (this,(string *)local_498);
              if (local_498[0] != local_488) {
                operator_delete(local_498[0]);
              }
            } while ((char)iVar3 != '\0');
            ServerOperation::getStatus_abi_cxx11_(&local_520,&this->super_ServerOperation);
            iVar3 = std::__cxx11::string::compare((char *)&local_520);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_520._M_dataplus._M_p != &local_520.field_2) {
              operator_delete(local_520._M_dataplus._M_p);
            }
            if (iVar3 == 0) {
              (*(this->super_ServerOperation)._vptr_ServerOperation[1])(&local_520,this);
              std::__cxx11::string::operator=((string *)&local_4e8,(string *)&local_520);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_520._M_dataplus._M_p != &local_520.field_2) {
                operator_delete(local_520._M_dataplus._M_p);
              }
              ServerOperation::getStatus_abi_cxx11_(&local_520,&this->super_ServerOperation);
              __buf._M_p = local_520._M_dataplus._M_p;
              ServerOperation::getStatus_abi_cxx11_(&local_4b8,&this->super_ServerOperation);
              send(iVar2,__buf._M_p,
                   CONCAT44(local_4b8._M_string_length._4_4_,(undefined4)local_4b8._M_string_length)
                   ,0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
                operator_delete(local_4b8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_520._M_dataplus._M_p != &local_520.field_2) {
                operator_delete(local_520._M_dataplus._M_p);
              }
            }
            else {
              ServerOperation::getStatus_abi_cxx11_(&local_4b8,&this->super_ServerOperation);
              plVar8 = (long *)std::__cxx11::string::append((char *)&local_4b8);
              psVar10 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_520.field_2._M_allocated_capacity = *psVar10;
                local_520.field_2._8_8_ = plVar8[3];
                local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
              }
              else {
                local_520.field_2._M_allocated_capacity = *psVar10;
                local_520._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_520._M_string_length = plVar8[1];
              *plVar8 = (long)psVar10;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              std::__cxx11::string::operator=((string *)&local_4e8,(string *)&local_520);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_520._M_dataplus._M_p != &local_520.field_2) {
                operator_delete(local_520._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
                operator_delete(local_4b8._M_dataplus._M_p);
              }
              send(iVar2,&local_500,4,0);
            }
            local_4b8._M_dataplus._M_p = (pointer)0x6c6f686563616c70;
            local_4b8._M_string_length._0_4_ = 0x726564;
            sVar4 = strlen((char *)&local_4b8);
            recv(iVar2,&local_4b8,sVar4,0);
            send(iVar2,local_4e8,(size_t)local_4e0,0);
            ServerOperation::getStatus_abi_cxx11_(&local_520,&this->super_ServerOperation);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_520._M_dataplus._M_p,
                                local_520._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_520._M_dataplus._M_p != &local_520.field_2) {
              operator_delete(local_520._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,local_4e8,(long)local_4e0);
          }
        } while (local_438[0] != 0x74697571);
        bVar1 = true;
        close(iVar2);
LAB_00103c77:
        if (local_4e8 != local_4d8) {
          operator_delete(local_4e8);
        }
      } while (bVar1);
    }
    else {
      local_524 = 1;
      perror("bind error");
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "No Port or Path to Mailpool directory specified.\nUsage: myserver <port number> <path>\n"
               ,0x56);
    local_524 = 1;
  }
  return local_524;
}

Assistant:

int main(int argc, char **argv) {
    //ToDo: Put this in Config file
    const char *MESSAGEDIR;
    const char USERDIR[6] = "users";
    const char SUCCESS[4] = "OK\n";
    const char FAILURE[5] = "ERR\n";
    const char EXECUTEPENDING[4] = "EP\n";
    int PORT;

    ServerOperation *command; //command the server executes

    //parse arguments
    if (argc == 3) {
        PORT = atoi(argv[1]);
        MESSAGEDIR = argv[2];
    } else {
        cout << "No Port or Path to Mailpool directory specified.\nUsage: myserver <port number> <path>\n";
        return EXIT_FAILURE;
    }

    //create needed directories
    createWorkingDirectories(MESSAGEDIR, USERDIR);

    //create socket
    int create_socket, new_socket;
    socklen_t addrlen;
    char buffer[BUF];
    long size;
    struct sockaddr_in address, cliaddress;

    create_socket = socket(AF_INET, SOCK_STREAM, 0);

    memset(&address, 0, sizeof(address));
    address.sin_family = AF_INET;
    address.sin_addr.s_addr = INADDR_ANY;
    address.sin_port = htons(PORT);

    if (bind(create_socket, (struct sockaddr *) &address, sizeof(address)) != 0) {
        perror("bind error");
        return EXIT_FAILURE;
    }
    listen(create_socket, 5);

    addrlen = sizeof(struct sockaddr_in);

    //start server loop:
    while (true) {
        printf("Waiting for connections...\n");
        new_socket = accept(create_socket, (struct sockaddr *) &cliaddress, &addrlen);
        if (new_socket > 0) {
            printf("Client connected from %s:%d...\n", inet_ntoa(cliaddress.sin_addr), ntohs(cliaddress.sin_port));
            strcpy(buffer, "Welcome to myserver, Please enter your command:\n");
            send(new_socket, buffer, strlen(buffer), 0);
        }
        //Client connected, start command execution loop:
        bool commandMatched = false;
        string commandResult = "";
        do {
            //get command
            size = recv(new_socket, buffer, BUF - 1, 0);
            if (size > 0) {
                buffer[size] = '\0';
                printf("Message received: %s", buffer);

                commandMatched = true; //we expect a real command, so reset it to true every command call

                //create the received command depending on string that was sent
                if (strncasecmp(buffer, "send", 4) == 0) {
                    command = new SendMessage(MESSAGEDIR);
                } else if (strncasecmp(buffer, "list", 4) == 0) {
                    command = new ListMessage(MESSAGEDIR);
                } else if (strncasecmp(buffer, "read", 4) == 0) {
                    command = new ReadMessage(MESSAGEDIR);
                } else if (strncasecmp(buffer, "del", 3) == 0) {
                    command = new DeleteMessage(MESSAGEDIR);
                } else if (strncasecmp(buffer, "quit", 4) == 0) {
                    //quit
                    //ToDo: make quit a real command :D
                    char message[] = "placeholder";
                    send(new_socket, SUCCESS, strlen(SUCCESS), 0);
                    recv(new_socket, message, strlen(message) - 1, 0); //always wait for confirmation
                    commandResult = "quit\n";
                    send(new_socket, commandResult.c_str(), commandResult.length(), 0);
                    break; //quit command loop -> new client can connect now
                } else {
                    //No commands matched
                    char message[] = "placeholder";
                    send(new_socket, FAILURE, strlen(FAILURE), 0);
                    recv(new_socket, message, strlen(message) - 1, 0); //always wait for confirmation
                    commandMatched = false;
                    commandResult = "No matching command found.\n";
                    send(new_socket, commandResult.c_str(), commandResult.length(), 0);
                }

                //if command was matched - get all the parameters and execute
                if (commandMatched) {
                    //get the parameters
                    do {
                        //always send the client confirmation and the instructions what to do
                        string confirmation = command->getStatus();
                        send(new_socket, confirmation.c_str(), confirmation.length(), 0);

                        //receive next line
                        size = recv(new_socket, buffer, BUF - 1, 0);
                        if (size > 0) {
                            buffer[size] = '\0';
                            printf("Message received: %s\n", buffer);
                        } else if (size == 0) {
                            printf("Client closed remote socket\n");
                            break;
                        } else {
                            perror("recv error");
                            return EXIT_FAILURE;
                        }


                    } while (command->fillMe(buffer)); //Fill Command with parameters till its satisfied

                    //were parameters filled correctly? if yes execute, if not return error message
                    if (command->getStatus() == EXECUTEPENDING) {
                        commandResult = command->execute(); //finally execute command

                        //send the status to the client:
                        send(new_socket, command->getStatus().c_str(), command->getStatus().length(),
                             0); //send command status
                    } else {
                        commandResult = command->getStatus() + "\n"; //save the status as command result

                        //send Error to the client:
                        send(new_socket, FAILURE, strlen(FAILURE), 0); //send command status
                    }
                    char message[] = "placeholder";
                    recv(new_socket, message, strlen(message), 0); //always wait for confirmation
                    send(new_socket, commandResult.c_str(), commandResult.length(), 0); //send command result

                    cout << command->getStatus() << "\n"; //ToDo: remove this line later
                    cout << commandResult; //ToDo: remove this line later
                }

            } else if (size == 0) {
                printf("Client closed remote socket\n");
                break;
            } else {
                perror("recv error");
                return EXIT_FAILURE;
            }
        } while (strncmp(buffer, "quit", 4) != 0);
        close(new_socket);
    }
    close(create_socket);
    return EXIT_SUCCESS;
}